

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv__udp_connect(uv_udp_t *handle,sockaddr *addr,uint addrlen)

{
  byte *pbVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = uv__udp_maybe_deferred_bind(handle,(uint)addr->sa_family,0);
  if (iVar2 == 0) {
    piVar3 = __errno_location();
    do {
      *piVar3 = 0;
      iVar2 = connect((handle->io_watcher).fd,(sockaddr *)addr,addrlen);
      if (iVar2 != -1) {
        if (iVar2 == 0) {
          pbVar1 = (byte *)((long)&handle->flags + 3);
          *pbVar1 = *pbVar1 | 2;
          return 0;
        }
        iVar2 = *piVar3;
        break;
      }
      iVar2 = *piVar3;
    } while (iVar2 == 4);
    iVar2 = -iVar2;
  }
  return iVar2;
}

Assistant:

int uv__udp_connect(uv_udp_t* handle,
                    const struct sockaddr* addr,
                    unsigned int addrlen) {
  int err;

  err = uv__udp_maybe_deferred_bind(handle, addr->sa_family, 0);
  if (err)
    return err;

  do {
    errno = 0;
    err = connect(handle->io_watcher.fd, addr, addrlen);
  } while (err == -1 && errno == EINTR);

  if (err)
    return UV__ERR(errno);

  handle->flags |= UV_HANDLE_UDP_CONNECTED;

  return 0;
}